

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

int glu::TextureTestUtil::computeTextureLookupDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,TextureCubeView *baseView,float *texCoord,
              ReferenceParams *sampleParams,LookupPrecision *lookupPrec,LodPrecision *lodPrec,
              qpWatchDog *watchDog)

{
  Vec3 *w;
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  int y;
  Vec3 *s;
  int faceSize;
  Vec3 *s_00;
  int lodOffsNdx;
  long lVar4;
  int z;
  ulong uVar5;
  Vec3 *s_01;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float width;
  float height;
  Vec4 VVar18;
  Vector<float,_4> VVar19;
  Vec3 coordDyo;
  Vec2 lodBounds;
  Vec3 coordDy;
  Vec3 coordDx;
  Vec3 coordDxo;
  Vec2 clampedLod;
  Vec3 coord;
  Vec2 lodBias;
  Vec4 refPix;
  Vec4 resPix;
  Vec3 triR [2];
  Vec3 triT [2];
  Vec3 triS [2];
  Vec2 lodO;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  TextureCubeView src;
  int local_2f4;
  float local_2f0;
  float local_2ec;
  Vec3 local_2c0;
  Vector<float,_2> local_2b0;
  float local_2a4;
  float local_2a0;
  Vec3 local_29c;
  undefined1 local_290 [16];
  Vec3 local_280;
  Vec3 local_274;
  PixelBufferAccess *local_268;
  Vec4 *local_260;
  Vec4 *local_258;
  undefined1 local_250 [20];
  float local_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  undefined4 uStack_220;
  float fStack_21c;
  Vector<float,_4> local_218;
  Vec4 local_208;
  Vec3 local_1f8;
  float local_1ec;
  float local_1e8;
  float local_1e4;
  Vec3 local_1d8;
  float local_1cc;
  float local_1c8;
  float local_1c4;
  Vec3 local_1b8;
  float local_1ac;
  float local_1a8;
  float local_1a4;
  Vec4 *local_198;
  ConstPixelBufferAccess *local_190;
  Sampler *local_188;
  ReferenceParams *local_180;
  ulong local_178;
  ulong local_170;
  ulong local_168;
  tcu local_160 [8];
  _Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_158;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [16];
  float local_108;
  float local_f8;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [4];
  float fStack_c4;
  ConstPixelBufferAccess *pCStack_c0;
  ConstPixelBufferAccess *local_b8;
  ConstPixelBufferAccess *pCStack_b0;
  ConstPixelBufferAccess *local_a8;
  ConstPixelBufferAccess *pCStack_a0;
  ConstPixelBufferAccess *local_98;
  undefined8 uStack_90;
  Vec3 local_88;
  float fStack_7c;
  undefined8 local_78;
  TextureCubeView local_68;
  
  local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268 = errorMask;
  local_190 = reference;
  getSubView((TextureCubeView *)local_c8,baseView,sampleParams->baseLevel,sampleParams->maxLevel);
  local_188 = &sampleParams->sampler;
  tcu::getEffectiveTextureView
            (&local_68,(TextureCubeView *)local_c8,
             (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &local_158,local_188);
  local_1b8.m_data[0] = *texCoord;
  local_1d8.m_data[0] = texCoord[1];
  local_1b8.m_data[1] = texCoord[3];
  local_1b8.m_data[2] = texCoord[6];
  local_1ac = texCoord[9];
  local_1d8.m_data[1] = texCoord[4];
  fVar13 = 0.0;
  fVar14 = 0.0;
  local_1d8.m_data[2] = texCoord[7];
  local_1cc = texCoord[10];
  local_1f8.m_data[0] = texCoord[2];
  local_1f8.m_data[1] = texCoord[5];
  local_1f8.m_data[2] = texCoord[8];
  local_1ec = texCoord[0xb];
  if (local_68.m_numLevels < 1) {
    faceSize = 0;
  }
  else {
    faceSize = (local_68.m_levels[0]->m_size).m_data[0];
  }
  width = (float)(result->m_size).m_data[0];
  height = (float)(result->m_size).m_data[1];
  local_88.m_data[0] = (sampleParams->super_RenderParams).w.m_data[0];
  local_88.m_data[1] = (sampleParams->super_RenderParams).w.m_data[1];
  local_88.m_data[2] = (sampleParams->super_RenderParams).w.m_data[2];
  fStack_7c = (sampleParams->super_RenderParams).w.m_data[3];
  local_78 = CONCAT44(local_88.m_data[1],local_88.m_data[2]);
  local_250._16_4_ = 0.0;
  if (((sampleParams->super_RenderParams).flags & 2) != 0) {
    local_250._16_4_ = (sampleParams->super_RenderParams).bias;
  }
  local_c8 = (undefined1  [4])0xbf800000;
  fStack_c4 = 0.0;
  pCStack_c0 = (ConstPixelBufferAccess *)0x3f800000;
  local_b8 = (ConstPixelBufferAccess *)0xbf80000000000000;
  pCStack_b0 = (ConstPixelBufferAccess *)0x3f80000000000000;
  local_a8 = (ConstPixelBufferAccess *)0xbf800000bf800000;
  pCStack_a0 = (ConstPixelBufferAccess *)0x3f800000bf800000;
  local_98 = (ConstPixelBufferAccess *)0xbf8000003f800000;
  uStack_90 = 0x3f8000003f800000;
  local_218.m_data[0] = -1.7146522e+38;
  local_23c = (float)local_250._16_4_;
  local_1e8 = local_1f8.m_data[2];
  local_1e4 = local_1f8.m_data[1];
  local_1c8 = local_1d8.m_data[2];
  local_1c4 = local_1d8.m_data[1];
  local_1a8 = local_1b8.m_data[2];
  local_1a4 = local_1b8.m_data[1];
  VVar18 = tcu::RGBA::toVec((RGBA *)&local_218);
  fVar7 = VVar18.m_data[3];
  tcu::clear(local_268,&local_208);
  local_258 = &(sampleParams->super_RenderParams).colorBias;
  local_260 = &(sampleParams->super_RenderParams).colorScale;
  local_198 = &lookupPrec->colorThreshold;
  uVar5 = 0;
  local_2f4 = 0;
  local_180 = sampleParams;
  local_138 = height;
  fStack_134 = height;
  fStack_130 = height;
  fStack_12c = height;
  local_128 = width;
  fStack_124 = width;
  fStack_120 = width;
  fStack_11c = width;
  do {
    if ((result->m_size).m_data[1] <= (int)uVar5) {
      std::_Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
      ~_Vector_base(&local_158);
      return local_2f4;
    }
    if (watchDog != (qpWatchDog *)0x0) {
      qpWatchDog_touch(watchDog);
    }
    local_238 = (float)(int)uVar5 + 0.5;
    local_e8 = local_238 / height;
    auVar16._0_4_ = local_238 + 0.0625;
    auVar16._4_4_ = local_238 + -0.0625;
    auVar16._8_4_ = local_238 + 0.0;
    auVar16._12_4_ = local_238 + 0.0;
    auVar11._4_4_ = fStack_134;
    auVar11._0_4_ = local_138;
    auVar11._8_4_ = fStack_130;
    auVar11._12_4_ = fStack_12c;
    local_118 = divps(auVar16,auVar11);
    local_108 = height - local_238;
    local_2a4 = 1.0 - local_e8;
    y = 0;
    fVar8 = fVar7;
    fVar9 = fVar14;
    fStack_234 = fVar7;
    fStack_230 = fVar13;
    fStack_22c = fVar14;
    local_178 = uVar5;
    fStack_e4 = fVar7;
    fStack_e0 = fVar13;
    fStack_dc = fVar14;
    while( true ) {
      z = (int)uVar5;
      if ((result->m_size).m_data[0] <= y) break;
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_250,(int)result,y,z);
      tcu::operator-((tcu *)&local_218,(Vector<float,_4> *)local_250,local_258);
      tcu::operator/((tcu *)&local_208,&local_218,local_260);
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_290,(int)local_190,y,z);
      tcu::operator-((tcu *)local_250,(Vector<float,_4> *)local_290,local_258);
      tcu::operator/((tcu *)&local_218,(Vector<float,_4> *)local_250,local_260);
      tcu::operator-((tcu *)local_290,&local_208,&local_218);
      VVar19 = tcu::abs<float,4>((tcu *)local_250,(Vector<float,_4> *)local_290);
      fVar7 = VVar19.m_data[3];
      tcu::lessThanEqual<float,4>((tcu *)&local_29c,(Vector<float,_4> *)local_250,local_198);
      bVar2 = tcu::boolAll<4>((Vector<bool,_4> *)&local_29c);
      if (!bVar2) {
        local_228 = (float)y + 0.5;
        auVar17._4_4_ = fVar8;
        auVar17._0_4_ = local_228;
        auVar17._8_4_ = 0;
        auVar17._12_4_ = fVar9;
        local_d8._4_12_ = auVar17._4_12_;
        local_d8._0_4_ = local_228 / width;
        auVar10._0_4_ = local_228 + 0.0625;
        auVar10._4_4_ = local_228 + -0.0625;
        auVar10._8_4_ = local_228 + 0.0;
        auVar10._12_4_ = local_228 + 0.0;
        auVar1._4_4_ = fStack_124;
        auVar1._0_4_ = local_128;
        auVar1._8_4_ = fStack_120;
        auVar1._12_4_ = fStack_11c;
        auVar11 = divps(auVar10,auVar1);
        fVar13 = auVar11._4_4_ + (float)local_118._4_4_;
        uStack_220 = 0;
        local_f8 = width - local_228;
        fVar12 = 0.0;
        fVar15 = 0.0;
        local_2a0 = 1.0 - (float)local_d8._0_4_;
        uVar3 = (ulong)(1.0 < fVar13);
        local_170 = (ulong)(1.0 <= auVar11._0_4_ + (float)local_118._0_4_);
        fVar14 = fVar13;
        fStack_224 = fVar8;
        fStack_21c = fVar9;
        do {
          if (local_170 < uVar3) {
            local_290._0_4_ = -1.7014636e+38;
            VVar18 = tcu::RGBA::toVec((RGBA *)local_290);
            fVar7 = VVar18.m_data[3];
            tcu::PixelBufferAccess::setPixel(local_268,(Vec4 *)local_250,y,(int)uVar5,0);
            local_2f4 = local_2f4 + 1;
            fVar8 = fVar12;
            fVar9 = fVar15;
            break;
          }
          local_2ec = local_228;
          local_2f0 = local_238;
          fVar14 = local_e8;
          fVar13 = (float)local_d8._0_4_;
          if (uVar3 != 0) {
            local_2ec = local_f8;
            local_2f0 = local_108;
            fVar14 = local_2a4;
            fVar13 = local_2a0;
          }
          s_00 = &local_1b8 + uVar3;
          w = &local_88 + uVar3;
          local_168 = uVar3;
          fVar7 = projectedTriInterpolate(s_00,w,fVar13,fVar14);
          s_01 = &local_1d8 + uVar3;
          fVar8 = projectedTriInterpolate(s_01,w,fVar13,fVar14);
          s = &local_1f8 + uVar3;
          local_250._8_4_ = projectedTriInterpolate(s,w,fVar13,fVar14);
          local_250._0_4_ = fVar7;
          local_250._4_4_ = fVar8;
          fVar7 = triDerivateX(s_00,w,local_228,width,fVar14);
          fVar8 = triDerivateX(s_01,w,local_228,width,fVar14);
          local_290._8_4_ = triDerivateX(s,w,local_228,width,fVar14);
          local_290._0_4_ = fVar7;
          local_290._4_4_ = fVar8;
          fVar8 = triDerivateY(s_00,w,local_238,height,fVar13);
          fVar9 = triDerivateY(s_01,w,local_238,height,fVar13);
          fVar12 = 0.0;
          fVar15 = 0.0;
          local_29c.m_data[2] = triDerivateY(s,w,local_238,height,fVar13);
          fVar7 = 0.0;
          fVar13 = 0.0;
          fVar14 = 0.0;
          local_29c.m_data[0] = fVar8;
          local_29c.m_data[1] = fVar9;
          tcu::computeCubeLodBoundsFromDerivates
                    ((tcu *)&local_2b0,(Vec3 *)local_250,(Vec3 *)local_290,&local_29c,faceSize,
                     lodPrec);
          for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
            fVar14 = *(float *)(local_c8 + lVar4 * 8) + local_2ec;
            fVar9 = *(float *)(local_c8 + lVar4 * 8 + 4) + local_2f0;
            fVar13 = fVar14 / width;
            fVar12 = fVar9 / height;
            fVar7 = projectedTriInterpolate(s_00,w,fVar13,fVar12);
            fVar8 = projectedTriInterpolate(s_01,w,fVar13,fVar12);
            local_274.m_data[2] = projectedTriInterpolate(s,w,fVar13,fVar12);
            local_274.m_data[0] = fVar7;
            local_274.m_data[1] = fVar8;
            fVar7 = triDerivateX(s_00,w,fVar14,width,fVar12);
            fVar8 = triDerivateX(s_01,w,fVar14,width,fVar12);
            local_280.m_data[2] = triDerivateX(s,w,fVar14,width,fVar12);
            local_280.m_data[0] = fVar7;
            local_280.m_data[1] = fVar8;
            fVar14 = triDerivateY(s_00,w,fVar9,height,fVar13);
            fVar7 = triDerivateY(s_01,w,fVar9,height,fVar13);
            local_2c0.m_data[2] = triDerivateY(s,w,fVar9,height,fVar13);
            local_2c0.m_data[1] = fVar7;
            local_2c0.m_data[0] = fVar14;
            tcu::computeCubeLodBoundsFromDerivates
                      (local_160,&local_274,(Vec3 *)(local_290 + 0x10),&local_2c0,faceSize,lodPrec);
            fVar7 = local_160._4_4_;
            fVar13 = 0.0;
            fVar14 = 0.0;
            uVar6 = -(uint)(local_2b0.m_data[0] <= local_160._0_4_);
            local_2b0.m_data[0] =
                 (float)(~uVar6 & (uint)local_160._0_4_ | (uint)local_2b0.m_data[0] & uVar6);
            fVar12 = (float)(~-(uint)(fVar7 <= local_2b0.m_data[1]) & (uint)fVar7 |
                            (uint)local_2b0.m_data[1] & -(uint)(fVar7 <= local_2b0.m_data[1]));
            fVar15 = 0.0;
            local_2b0.m_data[1] = fVar12;
          }
          tcu::operator+(&local_2b0,(Vector<float,_2> *)(local_250 + 0x10));
          local_2c0.m_data[0] = local_180->minLod;
          local_2c0.m_data[1] = local_180->maxLod;
          tcu::clampLodBounds((tcu *)&local_274,(Vec2 *)(local_290 + 0x10),(Vec2 *)&local_2c0,
                              lodPrec);
          bVar2 = tcu::isLookupResultValid
                            (&local_68,local_188,lookupPrec,(Vec3 *)local_250,(Vec2 *)&local_274,
                             &local_208);
          uVar3 = local_168 + 1;
          uVar5 = local_178;
          fVar8 = fVar12;
          fVar9 = fVar15;
        } while (!bVar2);
      }
      y = y + 1;
    }
    uVar5 = (ulong)(z + 1);
  } while( true );
}

Assistant:

int computeTextureLookupDiff (const tcu::ConstPixelBufferAccess&	result,
							  const tcu::ConstPixelBufferAccess&	reference,
							  const tcu::PixelBufferAccess&			errorMask,
							  const tcu::TextureCubeView&			baseView,
							  const float*							texCoord,
							  const ReferenceParams&				sampleParams,
							  const tcu::LookupPrecision&			lookupPrec,
							  const tcu::LodPrecision&				lodPrec,
							  qpWatchDog*							watchDog)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::TextureCubeView					src					= getEffectiveTextureView(getSubView(baseView, sampleParams.baseLevel, sampleParams.maxLevel), srcLevelStorage, sampleParams.sampler);

	const tcu::Vec4								sq					= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4								tq					= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4								rq					= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	const tcu::IVec2							dstSize				= tcu::IVec2(result.getWidth(), result.getHeight());
	const float									dstW				= float(dstSize.x());
	const float									dstH				= float(dstSize.y());
	const int									srcSize				= src.getSize();

	// Coordinates per triangle.
	const tcu::Vec3								triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3								triT[2]				= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3								triR[2]				= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2								lodBias				((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	const float									posEps				= 1.0f / float(1<<MIN_SUBPIXEL_BITS);

	int											numFailed			= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),

		// \note Not strictly allowed by spec, but implementations do this in practice.
		tcu::Vec2(-1, -1),
		tcu::Vec2(-1, +1),
		tcu::Vec2(+1, -1),
		tcu::Vec2(+1, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		// Ugly hack, validation can take way too long at the moment.
		if (watchDog)
			qpWatchDog_touch(watchDog);

		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= (result.getPixel(px, py)		- sampleParams.colorBias) / sampleParams.colorScale;
			const tcu::Vec4	refPix	= (reference.getPixel(px, py)	- sampleParams.colorBias) / sampleParams.colorScale;

			// Try comparison to ideal reference first, and if that fails use slower verificator.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(resPix - refPix), lookupPrec.colorThreshold)))
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const bool		tri0	= (wx-posEps)/dstW + (wy-posEps)/dstH <= 1.0f;
				const bool		tri1	= (wx+posEps)/dstW + (wy+posEps)/dstH >= 1.0f;

				bool			isOk	= false;

				DE_ASSERT(tri0 || tri1);

				// Pixel can belong to either of the triangles if it lies close enough to the edge.
				for (int triNdx = (tri0?0:1); triNdx <= (tri1?1:0); triNdx++)
				{
					const float		triWx	= triNdx ? dstW - wx : wx;
					const float		triWy	= triNdx ? dstH - wy : wy;
					const float		triNx	= triNdx ? 1.0f - nx : nx;
					const float		triNy	= triNdx ? 1.0f - ny : ny;

					const tcu::Vec3	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triR[triNdx], triW[triNdx], triNx, triNy));
					const tcu::Vec3	coordDx		(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
												 triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy),
												 triDerivateX(triR[triNdx], triW[triNdx], wx, dstW, triNy));
					const tcu::Vec3	coordDy		(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
												 triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx),
												 triDerivateY(triR[triNdx], triW[triNdx], wy, dstH, triNx));

					tcu::Vec2		lodBounds	= tcu::computeCubeLodBoundsFromDerivates(coord, coordDx, coordDy, srcSize, lodPrec);

					// Compute lod bounds across lodOffsets range.
					for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
					{
						const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
						const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
						const float		nxo		= wxo/dstW;
						const float		nyo		= wyo/dstH;

						const tcu::Vec3	coordO		(projectedTriInterpolate(triS[triNdx], triW[triNdx], nxo, nyo),
													 projectedTriInterpolate(triT[triNdx], triW[triNdx], nxo, nyo),
													 projectedTriInterpolate(triR[triNdx], triW[triNdx], nxo, nyo));
						const tcu::Vec3	coordDxo	(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
													 triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo),
													 triDerivateX(triR[triNdx], triW[triNdx], wxo, dstW, nyo));
						const tcu::Vec3	coordDyo	(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
													 triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo),
													 triDerivateY(triR[triNdx], triW[triNdx], wyo, dstH, nxo));
						const tcu::Vec2	lodO		= tcu::computeCubeLodBoundsFromDerivates(coordO, coordDxo, coordDyo, srcSize, lodPrec);

						lodBounds.x() = de::min(lodBounds.x(), lodO.x());
						lodBounds.y() = de::max(lodBounds.y(), lodO.y());
					}

					const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);

					if (tcu::isLookupResultValid(src, sampleParams.sampler, lookupPrec, coord, clampedLod, resPix))
					{
						isOk = true;
						break;
					}
				}

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}